

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringOpt.cpp
# Opt level: O0

void sznet::sz_split(string *s,
                    vector<sznet::StringPiece,_std::allocator<sznet::StringPiece>_> *tokens,
                    string *delimiters)

{
  string *this;
  long lVar1;
  int local_44;
  char *local_40;
  long local_38;
  size_t size;
  size_type endPos;
  size_type beginPos;
  string *delimiters_local;
  vector<sznet::StringPiece,_std::allocator<sznet::StringPiece>_> *tokens_local;
  string *s_local;
  
  beginPos = (size_type)delimiters;
  delimiters_local = (string *)tokens;
  tokens_local = (vector<sznet::StringPiece,_std::allocator<sznet::StringPiece>_> *)s;
  endPos = std::__cxx11::string::find_first_not_of((string *)s,(ulong)delimiters);
  size = std::__cxx11::string::find_first_of((string *)tokens_local,beginPos);
  while (size != 0xffffffffffffffff || endPos != 0xffffffffffffffff) {
    local_38 = size - endPos;
    if (size == 0xffffffffffffffff) {
      local_38 = std::__cxx11::string::size();
      local_38 = local_38 - endPos;
    }
    this = delimiters_local;
    lVar1 = std::__cxx11::string::data();
    local_40 = (char *)(lVar1 + endPos);
    local_44 = (int)local_38;
    std::vector<sznet::StringPiece,std::allocator<sznet::StringPiece>>::
    emplace_back<char_const*,int>
              ((vector<sznet::StringPiece,std::allocator<sznet::StringPiece>> *)this,&local_40,
               &local_44);
    endPos = std::__cxx11::string::find_first_not_of((string *)tokens_local,beginPos);
    size = std::__cxx11::string::find_first_of((string *)tokens_local,beginPos);
  }
  return;
}

Assistant:

void sz_split(const sznet::string& s, std::vector<sznet::StringPiece>& tokens, const sznet::string& delimiters)
{
	sznet::string::size_type beginPos = s.find_first_not_of(delimiters, 0);
	sznet::string::size_type endPos = s.find_first_of(delimiters, beginPos);
	size_t size = 0;
	while (sznet::string::npos != endPos || sznet::string::npos != beginPos)
	{
		size = endPos - beginPos;
		if (endPos == sznet::string::npos)
		{
			size = s.size() - beginPos;
		}
		// assert(size <= std::numeric_limits<int>::max());
		tokens.emplace_back(s.data() + beginPos, static_cast<int>(size));
		beginPos = s.find_first_not_of(delimiters, endPos);
		endPos = s.find_first_of(delimiters, beginPos);
	}
}